

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O1

void __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::ReComputeH
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,BGIP_BnB_NodePtr *node)

{
  int *piVar1;
  undefined1 auVar2 [16];
  Index jt_bgI;
  sp_counted_base *psVar3;
  element_type *peVar4;
  bool bVar5;
  ulong uVar6;
  ostream *poVar7;
  E *this_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> valid_JAs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  BGIP_BnB_NodePtr local_68;
  ulong local_58;
  ulong local_50;
  element_type *local_48;
  shared_count asStack_40 [2];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  uVar6 = BayesianGameBase::GetNrJointTypes();
  uVar9 = (ulong)*(uint *)(node->px + 0x20);
  dVar11 = 0.0;
  if (uVar9 < uVar6) {
    auVar13 = ZEXT816(0);
    do {
      local_50 = auVar13._0_8_;
      psVar3 = (node->pn).pi_;
      local_48 = node->px;
      asStack_40[0].pi_ = (node->pn).pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar3->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      jt_bgI = (this->_m_jtIndexMapping).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      boost::detail::shared_count::~shared_count(asStack_40);
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar3 = (node->pn).pi_;
      local_68.px = node->px;
      local_68.pn.pi_ = (node->pn).pi_;
      if (psVar3 != (sp_counted_base *)0x0) {
        LOCK();
        piVar1 = &psVar3->use_count_;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      ComputeValidJointActions(this,jt_bgI,&local_88,&local_68);
      boost::detail::shared_count::~shared_count(&local_68.pn);
      uVar12 = 0xffefffffffffffff;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        auVar13 = ZEXT816(0xffefffffffffffff);
        uVar8 = 0;
        uVar10 = 1;
        do {
          peVar4 = (this->_m_bgip).px;
          auVar15._0_8_ =
               (**(code **)(*(long *)peVar4 + 0x80))
                         (peVar4,jt_bgI,
                          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar8]);
          auVar15._8_56_ = extraout_var;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = auVar13._0_8_;
          auVar13 = vmaxsd_avx(auVar17,auVar15._0_16_);
          uVar12 = auVar13._0_8_;
          bVar5 = uVar10 < (ulong)((long)local_88.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2);
          uVar8 = uVar10;
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (bVar5);
      }
      peVar4 = (this->_m_bgip).px;
      auVar16._0_8_ = (**(code **)(*(long *)peVar4 + 0x68))(peVar4,jt_bgI);
      auVar16._8_56_ = extraout_var_00;
      auVar13 = auVar16._0_16_;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_58 = auVar16._0_8_;
        operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_58;
      }
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar12;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_50;
      auVar13 = vfmadd213sd_fma(auVar14,auVar13,auVar2);
      dVar11 = auVar13._0_8_;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (uVar9 < uVar6);
  }
  if (2 < this->_m_verbosity) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\tBGIP_SolverBranchAndBoundUpdated H from ",0x29);
    poVar7 = std::ostream::_M_insert<double>(*(double *)(node->px + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
    poVar7 = std::ostream::_M_insert<double>(dVar11);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  BGIP_BnB_Node::SetH(dVar11);
  if (this->_m_reComputeJTIndexMapping != true) {
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"BGIP_SolverBranchAndBound::ReComputeH unhandled BnB_JointTypeOrdering");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void ReComputeH(BGIP_BnB_NodePtr node)
{
    size_t nrJT = _m_bgip->GetNrJointTypes();
    //size_t _m_nrAgents = _m_bgip->GetNrAgents();
    double h=0;
    for(Index jt_oI = node->GetDepth(); jt_oI < nrJT; ++jt_oI)
    {
        Index jt_bgI = GetJTIndexMapping(jt_oI, node);    
        double bestValue=-DBL_MAX;
        std::vector< Index > valid_JAs;
        //the next call assumes that the induced policy for *node*
        //has been set!
        ComputeValidJointActions(jt_bgI, valid_JAs, node);
        for(Index val_jaI=0; val_jaI < valid_JAs.size(); val_jaI++)
        {
            Index ja = valid_JAs[val_jaI];
            double c=_m_bgip->GetUtility(jt_bgI,ja);
            bestValue=std::max(c,bestValue);
        }
        h+=_m_bgip->GetProbability(jt_bgI)*bestValue;
    }
    if(_m_verbosity>2)
        std::cout << "\tBGIP_SolverBranchAndBoundUpdated H from " << node->GetH()
                  << " to " << h << std::endl;
    node->SetH(h);

    if(_m_reComputeJTIndexMapping)
    {
    switch(_m_jtOrdering)
    {
#if DYNAMIC_JT_INDEX_MAPPING
    case BGIP_BnB::ConsistentMaxContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMaxContribution nyi"));
//         std::vector<double> CIvalues=_m_completeInformationValues;
//         const std::vector<double> & origCIvalues=_m_completeInformationValues;
//         SortDescending(CIvalues);

//         ReOrderJointTypes(origCIvalues,CIvalues,jtIndexMapping);
        break;
    }
    // reorder to have joint types with the worst
    // heuristic complete information values first
    case BGIP_BnB::ConsistentMinContribution:
    {
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled ConsistentMinContribution nyi"));
//         std::vector<double> minValues=ComputeMinContributionValues();
//         std::vector<double> origMinValues=minValues;
//         // sorts in ascending order, no need to invert now
//         SortAscending(minValues);

//         if(_m_verbosity>2)
//             std::cout << "Sorted Minimum contribution values: "
//                       << SoftPrintVector(minValues)
//                       << std::endl;
//         ReOrderJointTypes(origMinValues,minValues,jtIndexMapping);
        break;
    }
    case BGIP_BnB::ConsistentMaxContributionDifference:
    {
//         std::vector<vector < Index > > impliedJpol=InitImpliedJPol();
//         node->GetImpliedJPol(impliedJpol);
        size_t nrJTtoReOrder=_m_bgip->GetNrJointTypes() - node->GetDepth();
        std::vector<double> origDiffValues(nrJTtoReOrder);
        std::vector<Index> jtIndexMappingPartial(nrJTtoReOrder);
        std::vector<bool> jaAlreadySpecified(_m_bgip->GetNrJointActions(), false);

        std::vector< std::vector< Index > > impliedJPol(_m_nrAgents);
        for(Index agI=0; agI < _m_nrAgents; agI++)
        {
            impliedJPol[agI] = std::vector< Index >(
                _m_bgip->GetNrTypes(agI), UNSPECIFIED_ACTION );
        }
        node->GetImpliedJPol(impliedJPol);

        for(Index i=0;i!=origDiffValues.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            Index jtI=node->GetJTIndexMapping(jt_oI);
            jtIndexMappingPartial.at(i)=jtI;
            double minValue=DBL_MAX;
            double maxValue=-DBL_MAX;
            const std::vector<Index> &indTypes=
                _m_bgip->JointToIndividualTypeIndices(jtI);
            
            for(Index ja=0;ja!=_m_bgip->GetNrJointActions();++ja)
            {
                const std::vector<Index> &indActions=
                    _m_bgip->JointToIndividualActionIndices(ja);

                bool jaAlreadySpecified=true;
                for(Index agI=0;agI!=_m_nrAgents;++agI)
                {
                    if(impliedJPol[agI][indTypes[agI]]!=indActions[agI])
                        jaAlreadySpecified=false;
                }
                if(!jaAlreadySpecified)
                {
                    double c=GetContribution(jtI,ja);
                    minValue=std::min(c,minValue);
                    maxValue=std::max(c,maxValue);
                }
            }
            origDiffValues[i]=maxValue-minValue;
        }

        std::vector<double> diffValues=origDiffValues;

        SortDescending(diffValues);
        
        if(_m_verbosity>2)
        {
            std::cout << "BGIP_SolverBranchAndBound Original Max difference contribution values: "
                      << SoftPrintVector(origDiffValues)
                      << std::endl;
            std::cout << "BGIP_SolverBranchAndBound Sorted Max difference contribution values: "
                      << SoftPrintVector(diffValues)
                      << std::endl;
        }
        std::vector<Index> jtIndexMapping;
        ReOrderJointTypes(jtIndexMappingPartial,
                          origDiffValues,
                          diffValues,
                          jtIndexMapping);
        for(Index i=0;i!=jtIndexMapping.size();++i)
        {
            Index jt_oI=node->GetDepth() + i;
            node->SetJTIndexMapping(jt_oI, jtIndexMapping[i]);
        }
        break;
    }
#endif
    default:
        throw(E("BGIP_SolverBranchAndBound::ReComputeH unhandled BnB_JointTypeOrdering"));
    }

    }
}